

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O1

void __thiscall tst_GenericModel::moveRowsTreeSameBranch(tst_GenericModel *this)

{
  long lVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  value_type args;
  QPersistentModelIndex oneIndex;
  GenericModel testModel;
  QModelIndex parIndex;
  QPersistentModelIndex twoIndex;
  QSignalSpy *spyArr [2];
  anon_class_16_2_c8a22591 resetData;
  ModelTest probe;
  QSignalSpy rowsAboutToBeMovedSpy;
  QSignalSpy rowsMovedSpy;
  QChar local_1ea;
  anon_union_24_3_e3d07ef4_for_data local_1e8;
  undefined8 local_1d0;
  QModelIndex local_1c8;
  QChar local_1b0 [4];
  QModelIndex local_1a8;
  QChar local_18a;
  QModelIndex local_188;
  QPersistentModelIndex local_170 [8];
  QSignalSpy *local_168 [3];
  anon_class_16_2_c8a22591 local_150;
  undefined **local_140 [2];
  QSignalSpy local_130;
  QSignalSpy local_b0;
  
  GenericModel::GenericModel((GenericModel *)&local_1a8,(QObject *)0x0);
  QAbstractItemModelTester::QAbstractItemModelTester
            ((QAbstractItemModelTester *)local_140,(QAbstractItemModel *)&local_1a8,QtTest,
             (QObject *)0x0);
  local_140[0] = &PTR_metaObject_001659f8;
  local_130.super_QObject = (QObject)0xff;
  local_130._1_7_ = 0xffffffffffffff;
  local_130._8_8_ = 0;
  local_130.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::insertColumns((int)&local_1a8,0,(QModelIndex *)0x2);
  local_130.super_QObject = (QObject)0xff;
  local_130._1_7_ = 0xffffffffffffff;
  local_130._8_8_ = 0;
  local_130.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::insertRows((int)&local_1a8,0,(QModelIndex *)0x3);
  local_130.super_QObject = (QObject)0xff;
  local_130._1_7_ = 0xffffffffffffff;
  local_130._8_8_ = 0;
  local_130.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::index((int)&local_188,(int)&local_1a8,(QModelIndex *)0x1);
  GenericModel::insertColumns((int)&local_1a8,0,(QModelIndex *)0x2);
  GenericModel::insertRows((int)&local_1a8,0,(QModelIndex *)0x6);
  QSignalSpy::QSignalSpy
            (&local_130,(QObject *)&local_1a8,
             "2rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)");
  cVar2 = QTest::qVerify(local_130.sig.d.size != 0,"rowsAboutToBeMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x67c);
  if (cVar2 == '\0') goto LAB_001252e7;
  QSignalSpy::QSignalSpy
            (&local_b0,(QObject *)&local_1a8,"2rowsMoved(QModelIndex, int, int, QModelIndex, int)");
  cVar2 = QTest::qVerify(local_b0.sig.d.size != 0,"rowsMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x67e);
  if (cVar2 != '\0') {
    local_168[0] = &local_130;
    local_168[1] = &local_b0;
    local_150.testModel = (GenericModel *)&local_1a8;
    local_150.parIndex = &local_188;
    moveRowsTreeSameBranch::anon_class_16_2_c8a22591::operator()(&local_150);
    bVar3 = GenericModel::moveRows(&local_1a8,(int)&local_188,2,(QModelIndex *)0x1,(int)&local_188);
    cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveRows(parIndex, 2, 1, parIndex, -1)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x688);
    if (cVar2 != '\0') {
      lVar6 = 0;
      do {
        cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)local_168 + lVar6) + 0x20),0,
                                "spy->count()","0",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x68a);
        if (cVar2 == '\0') goto LAB_00125260;
        lVar6 = lVar6 + 8;
      } while (lVar6 != 0x10);
      bVar3 = GenericModel::moveRows
                        (&local_1a8,(int)&local_188,2,(QModelIndex *)0x1,(int)&local_188);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveRows(parIndex, 2, 1, parIndex, 7)",""
                             ,
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x68b);
      if (cVar2 != '\0') {
        lVar6 = 0;
        do {
          cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)local_168 + lVar6) + 0x20),0,
                                  "spy->count()","0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x68d);
          if (cVar2 == '\0') goto LAB_00125260;
          lVar6 = lVar6 + 8;
        } while (lVar6 != 0x10);
        bVar3 = GenericModel::moveRows
                          (&local_1a8,(int)&local_188,-1,(QModelIndex *)0x1,(int)&local_188);
        cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveRows(parIndex, -1, 1, parIndex, 3)"
                               ,"",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x68e);
        if (cVar2 != '\0') {
          lVar6 = 0;
          do {
            cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)local_168 + lVar6) + 0x20),0,
                                    "spy->count()","0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x690);
            if (cVar2 == '\0') goto LAB_00125260;
            lVar6 = lVar6 + 8;
          } while (lVar6 != 0x10);
          bVar3 = GenericModel::moveRows
                            (&local_1a8,(int)&local_188,6,(QModelIndex *)0x1,(int)&local_188);
          cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                                 "!testModel.moveRows(parIndex, 6, 1, parIndex, 3)","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x691);
          if (cVar2 != '\0') {
            lVar6 = 0;
            do {
              cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)local_168 + lVar6) + 0x20),0,
                                      "spy->count()","0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x693);
              if (cVar2 == '\0') goto LAB_00125260;
              lVar6 = lVar6 + 8;
            } while (lVar6 != 0x10);
            bVar3 = GenericModel::moveRows
                              (&local_1a8,(int)&local_188,1,(QModelIndex *)0x2,(int)&local_188);
            cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                                   "!testModel.moveRows(parIndex, 1, 2, parIndex, 2)","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                   ,0x694);
            if (cVar2 != '\0') {
              lVar6 = 0;
              do {
                cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)local_168 + lVar6) + 0x20),0,
                                        "spy->count()","0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x696);
                if (cVar2 == '\0') goto LAB_00125260;
                lVar6 = lVar6 + 8;
              } while (lVar6 != 0x10);
              bVar3 = GenericModel::moveRows
                                (&local_1a8,(int)&local_188,1,(QModelIndex *)0x2,(int)&local_188);
              cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                                     "!testModel.moveRows(parIndex, 1, 2, parIndex, 3)","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x697);
              if (cVar2 != '\0') {
                lVar6 = 0;
                do {
                  cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)local_168 + lVar6) + 0x20),0
                                          ,"spy->count()","0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x699);
                  if (cVar2 == '\0') goto LAB_00125260;
                  lVar6 = lVar6 + 8;
                } while (lVar6 != 0x10);
                GenericModel::index((int)&local_1e8,(int)&local_1a8,(QModelIndex *)0x2);
                QPersistentModelIndex::QPersistentModelIndex(local_170,(QModelIndex *)&local_1e8);
                bVar4 = (bool)GenericModel::moveRows
                                        (&local_1a8,(int)&local_188,2,(QModelIndex *)0x1,
                                         (int)&local_188);
                cVar2 = QTest::qVerify(bVar4,"testModel.moveRows(parIndex, 2, 1, parIndex, 4)","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                       ,0x69c);
                if (cVar2 != '\0') {
                  GenericModel::index((int)&local_1c8,(int)&local_1a8,(QModelIndex *)0x0);
                  if (local_1c8.m == (QAbstractItemModel *)0x0) {
                    local_1e8.shared = (PrivateShared *)0x0;
                    local_1e8._8_8_ = (QVariant *)0x0;
                    local_1e8._16_8_ = 0;
                    local_1d0 = 2;
                  }
                  else {
                    (**(code **)(*(long *)local_1c8.m + 0x90))(&local_1e8,local_1c8.m,&local_1c8,0);
                  }
                  iVar5 = QVariant::toInt((bool *)local_1e8.data);
                  cVar2 = QTest::qCompare(iVar5,0,"testModel.index(0, 0, parIndex).data().toInt()",
                                          "0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x69d);
                  QVariant::~QVariant((QVariant *)&local_1e8);
                  if (cVar2 != '\0') {
                    GenericModel::index((int)&local_1c8,(int)&local_1a8,(QModelIndex *)0x1);
                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                      local_1e8.shared = (PrivateShared *)0x0;
                      local_1e8._8_8_ = (QVariant *)0x0;
                      local_1e8._16_8_ = 0;
                      local_1d0 = 2;
                    }
                    else {
                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                (&local_1e8,local_1c8.m,&local_1c8,0);
                    }
                    iVar5 = QVariant::toInt((bool *)local_1e8.data);
                    cVar2 = QTest::qCompare(iVar5,1,"testModel.index(1, 0, parIndex).data().toInt()"
                                            ,"1",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x69e);
                    QVariant::~QVariant((QVariant *)&local_1e8);
                    if (cVar2 != '\0') {
                      GenericModel::index((int)&local_1c8,(int)&local_1a8,(QModelIndex *)0x2);
                      if (local_1c8.m == (QAbstractItemModel *)0x0) {
                        local_1e8.shared = (PrivateShared *)0x0;
                        local_1e8._8_8_ = (QVariant *)0x0;
                        local_1e8._16_8_ = 0;
                        local_1d0 = 2;
                      }
                      else {
                        (**(code **)(*(long *)local_1c8.m + 0x90))
                                  (&local_1e8,local_1c8.m,&local_1c8,0);
                      }
                      iVar5 = QVariant::toInt((bool *)local_1e8.data);
                      cVar2 = QTest::qCompare(iVar5,3,
                                              "testModel.index(2, 0, parIndex).data().toInt()","3",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x69f);
                      QVariant::~QVariant((QVariant *)&local_1e8);
                      if (cVar2 != '\0') {
                        GenericModel::index((int)&local_1c8,(int)&local_1a8,(QModelIndex *)0x3);
                        if (local_1c8.m == (QAbstractItemModel *)0x0) {
                          local_1e8.shared = (PrivateShared *)0x0;
                          local_1e8._8_8_ = (QVariant *)0x0;
                          local_1e8._16_8_ = 0;
                          local_1d0 = 2;
                        }
                        else {
                          (**(code **)(*(long *)local_1c8.m + 0x90))
                                    (&local_1e8,local_1c8.m,&local_1c8,0);
                        }
                        iVar5 = QVariant::toInt((bool *)local_1e8.data);
                        cVar2 = QTest::qCompare(iVar5,2,
                                                "testModel.index(3, 0, parIndex).data().toInt()","2"
                                                ,
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x6a0);
                        QVariant::~QVariant((QVariant *)&local_1e8);
                        if (cVar2 != '\0') {
                          GenericModel::index((int)&local_1c8,(int)&local_1a8,(QModelIndex *)0x4);
                          if (local_1c8.m == (QAbstractItemModel *)0x0) {
                            local_1e8.shared = (PrivateShared *)0x0;
                            local_1e8._8_8_ = (QVariant *)0x0;
                            local_1e8._16_8_ = 0;
                            local_1d0 = 2;
                          }
                          else {
                            (**(code **)(*(long *)local_1c8.m + 0x90))
                                      (&local_1e8,local_1c8.m,&local_1c8,0);
                          }
                          iVar5 = QVariant::toInt((bool *)local_1e8.data);
                          cVar2 = QTest::qCompare(iVar5,4,
                                                  "testModel.index(4, 0, parIndex).data().toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6a1);
                          QVariant::~QVariant((QVariant *)&local_1e8);
                          if (cVar2 != '\0') {
                            GenericModel::index((int)&local_1c8,(int)&local_1a8,(QModelIndex *)0x5);
                            if (local_1c8.m == (QAbstractItemModel *)0x0) {
                              local_1e8.shared = (PrivateShared *)0x0;
                              local_1e8._8_8_ = (QVariant *)0x0;
                              local_1e8._16_8_ = 0;
                              local_1d0 = 2;
                            }
                            else {
                              (**(code **)(*(long *)local_1c8.m + 0x90))
                                        (&local_1e8,local_1c8.m,&local_1c8,0);
                            }
                            iVar5 = QVariant::toInt((bool *)local_1e8.data);
                            cVar2 = QTest::qCompare(iVar5,5,
                                                  "testModel.index(5, 0, parIndex).data().toInt()",
                                                  "5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6a2);
                            QVariant::~QVariant((QVariant *)&local_1e8);
                            if (cVar2 != '\0') {
                              GenericModel::index((int)&local_1c8,(int)&local_1a8,(QModelIndex *)0x0
                                                 );
                              if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                local_1e8.shared = (PrivateShared *)0x0;
                                local_1e8._8_8_ = (QVariant *)0x0;
                                local_1e8._16_8_ = 0;
                                local_1d0 = 2;
                              }
                              else {
                                (**(code **)(*(long *)local_1c8.m + 0x90))
                                          (&local_1e8,local_1c8.m,&local_1c8,0);
                              }
                              local_1b0[0] = QVariant::value<QChar>((QVariant *)&local_1e8);
                              local_1ea.ucs = L'a';
                              bVar4 = QTest::qCompare<QChar,QChar>
                                                (local_1b0,&local_1ea,
                                                 "testModel.index(0, 1, parIndex).data().value<QChar>()"
                                                 ,"QChar(QLatin1Char(\'a\'))",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                 ,0x6a3);
                              QVariant::~QVariant((QVariant *)&local_1e8);
                              if (bVar4) {
                                GenericModel::index((int)&local_1c8,(int)&local_1a8,
                                                    (QModelIndex *)0x1);
                                if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                  local_1e8.shared = (PrivateShared *)0x0;
                                  local_1e8._8_8_ = (QVariant *)0x0;
                                  local_1e8._16_8_ = 0;
                                  local_1d0 = 2;
                                }
                                else {
                                  (**(code **)(*(long *)local_1c8.m + 0x90))
                                            (&local_1e8,local_1c8.m,&local_1c8,0);
                                }
                                local_1b0[0] = QVariant::value<QChar>((QVariant *)&local_1e8);
                                local_1ea.ucs = L'b';
                                bVar4 = QTest::qCompare<QChar,QChar>
                                                  (local_1b0,&local_1ea,
                                                                                                      
                                                  "testModel.index(1, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6a4);
                                QVariant::~QVariant((QVariant *)&local_1e8);
                                if (bVar4) {
                                  GenericModel::index((int)&local_1c8,(int)&local_1a8,
                                                      (QModelIndex *)0x2);
                                  if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                    local_1e8.shared = (PrivateShared *)0x0;
                                    local_1e8._8_8_ = (QVariant *)0x0;
                                    local_1e8._16_8_ = 0;
                                    local_1d0 = 2;
                                  }
                                  else {
                                    (**(code **)(*(long *)local_1c8.m + 0x90))
                                              (&local_1e8,local_1c8.m,&local_1c8,0);
                                  }
                                  local_1b0[0] = QVariant::value<QChar>((QVariant *)&local_1e8);
                                  local_1ea.ucs = L'd';
                                  bVar4 = QTest::qCompare<QChar,QChar>
                                                    (local_1b0,&local_1ea,
                                                                                                          
                                                  "testModel.index(2, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'d\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6a5);
                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                  if (bVar4) {
                                    GenericModel::index((int)&local_1c8,(int)&local_1a8,
                                                        (QModelIndex *)0x3);
                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                      local_1e8.shared = (PrivateShared *)0x0;
                                      local_1e8._8_8_ = (QVariant *)0x0;
                                      local_1e8._16_8_ = 0;
                                      local_1d0 = 2;
                                    }
                                    else {
                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                (&local_1e8,local_1c8.m,&local_1c8,0);
                                    }
                                    local_1b0[0] = QVariant::value<QChar>((QVariant *)&local_1e8);
                                    local_1ea.ucs = L'c';
                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                      (local_1b0,&local_1ea,
                                                                                                              
                                                  "testModel.index(3, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6a6);
                                    QVariant::~QVariant((QVariant *)&local_1e8);
                                    if (bVar4) {
                                      GenericModel::index((int)&local_1c8,(int)&local_1a8,
                                                          (QModelIndex *)0x4);
                                      if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                        local_1e8.shared = (PrivateShared *)0x0;
                                        local_1e8._8_8_ = (QVariant *)0x0;
                                        local_1e8._16_8_ = 0;
                                        local_1d0 = 2;
                                      }
                                      else {
                                        (**(code **)(*(long *)local_1c8.m + 0x90))
                                                  (&local_1e8,local_1c8.m,&local_1c8,0);
                                      }
                                      local_1b0[0] = QVariant::value<QChar>((QVariant *)&local_1e8);
                                      local_1ea.ucs = L'e';
                                      bVar4 = QTest::qCompare<QChar,QChar>
                                                        (local_1b0,&local_1ea,
                                                                                                                  
                                                  "testModel.index(4, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'e\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6a7);
                                      QVariant::~QVariant((QVariant *)&local_1e8);
                                      if (bVar4) {
                                        GenericModel::index((int)&local_1c8,(int)&local_1a8,
                                                            (QModelIndex *)0x5);
                                        if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                          local_1e8.shared = (PrivateShared *)0x0;
                                          local_1e8._8_8_ = (QVariant *)0x0;
                                          local_1e8._16_8_ = 0;
                                          local_1d0 = 2;
                                        }
                                        else {
                                          (**(code **)(*(long *)local_1c8.m + 0x90))
                                                    (&local_1e8,local_1c8.m,&local_1c8,0);
                                        }
                                        local_1b0[0] = QVariant::value<QChar>
                                                                 ((QVariant *)&local_1e8);
                                        local_1ea.ucs = L'f';
                                        bVar4 = QTest::qCompare<QChar,QChar>
                                                          (local_1b0,&local_1ea,
                                                                                                                      
                                                  "testModel.index(5, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'f\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6a8);
                                        QVariant::~QVariant((QVariant *)&local_1e8);
                                        if (bVar4) {
                                          QPersistentModelIndex::data((int)&local_1e8);
                                          local_1c8.r._0_2_ =
                                               QVariant::value<QChar>((QVariant *)&local_1e8);
                                          local_1b0[0].ucs = L'c';
                                          bVar4 = QTest::qCompare<QChar,QChar>
                                                            ((QChar *)&local_1c8,local_1b0,
                                                             "twoIndex.data().value<QChar>()",
                                                             "QChar(QLatin1Char(\'c\'))",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6a9);
                                          QVariant::~QVariant((QVariant *)&local_1e8);
                                          if (bVar4) {
                                            iVar5 = QPersistentModelIndex::row();
                                            cVar2 = QTest::qCompare(iVar5,3,"twoIndex.row()","3",
                                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6aa);
                                            if (cVar2 != '\0') {
                                              lVar6 = 0;
                                              do {
                                                lVar1 = *(long *)((long)local_168 + lVar6);
                                                cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),
                                                                        1,"spy->count()","1",
                                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6ac);
                                                if (cVar2 == '\0') goto LAB_00125253;
                                                QList<QList<QVariant>_>::takeFirst
                                                          ((value_type *)&local_1e8,
                                                           (QList<QList<QVariant>_> *)(lVar1 + 0x10)
                                                          );
                                                QVariant::value<QModelIndex>
                                                          (&local_1c8,(QVariant *)local_1e8._8_8_);
                                                bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                  (&local_1c8,&local_188,
                                                                   "args.at(0).value<QModelIndex>()"
                                                                   ,"parIndex",
                                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6ae);
                                                if (!bVar4) goto LAB_00125249;
                                                iVar5 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                0x20));
                                                cVar2 = QTest::qCompare(iVar5,2,"args.at(1).toInt()"
                                                                        ,"2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6af);
                                                if (cVar2 == '\0') goto LAB_00125249;
                                                iVar5 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                0x40));
                                                cVar2 = QTest::qCompare(iVar5,2,"args.at(2).toInt()"
                                                                        ,"2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6b0);
                                                if (cVar2 == '\0') goto LAB_00125249;
                                                QVariant::value<QModelIndex>
                                                          (&local_1c8,
                                                           (QVariant *)(local_1e8._8_8_ + 0x60));
                                                bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                  (&local_1c8,&local_188,
                                                                   "args.at(3).value<QModelIndex>()"
                                                                   ,"parIndex",
                                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6b1);
                                                if (!bVar4) goto LAB_00125249;
                                                iVar5 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                0x80));
                                                cVar2 = QTest::qCompare(iVar5,4,"args.at(4).toInt()"
                                                                        ,"4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6b2);
                                                QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                          ((QArrayDataPointer<QVariant> *)&local_1e8
                                                          );
                                                if (cVar2 == '\0') goto LAB_00125253;
                                                lVar6 = lVar6 + 8;
                                              } while (lVar6 != 0x10);
                                              moveRowsTreeSameBranch::anon_class_16_2_c8a22591::
                                              operator()(&local_150);
                                              GenericModel::index((int)&local_1e8,(int)&local_1a8,
                                                                  (QModelIndex *)0x2);
                                              QPersistentModelIndex::operator=
                                                        (local_170,(QModelIndex *)&local_1e8);
                                              bVar4 = (bool)GenericModel::moveRows
                                                                      (&local_1a8,(int)&local_188,2,
                                                                       (QModelIndex *)0x1,
                                                                       (int)&local_188);
                                              cVar2 = QTest::qVerify(bVar4,
                                                  "testModel.moveRows(parIndex, 2, 1, parIndex, 0)",
                                                  "",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6b7);
                                              if (cVar2 != '\0') {
                                                GenericModel::index((int)&local_1c8,(int)&local_1a8,
                                                                    (QModelIndex *)0x0);
                                                if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                  local_1e8.shared = (PrivateShared *)0x0;
                                                  local_1e8._8_8_ = (QVariant *)0x0;
                                                  local_1e8._16_8_ = 0;
                                                  local_1d0 = 2;
                                                }
                                                else {
                                                  (**(code **)(*(long *)local_1c8.m + 0x90))
                                                            (&local_1e8,local_1c8.m,&local_1c8,0);
                                                }
                                                iVar5 = QVariant::toInt((bool *)local_1e8.data);
                                                cVar2 = QTest::qCompare(iVar5,2,
                                                  "testModel.index(0, 0, parIndex).data().toInt()",
                                                  "2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6b8);
                                                QVariant::~QVariant((QVariant *)&local_1e8);
                                                if (cVar2 != '\0') {
                                                  GenericModel::index((int)&local_1c8,
                                                                      (int)&local_1a8,
                                                                      (QModelIndex *)0x1);
                                                  if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                    local_1e8.shared = (PrivateShared *)0x0;
                                                    local_1e8._8_8_ = (QVariant *)0x0;
                                                    local_1e8._16_8_ = 0;
                                                    local_1d0 = 2;
                                                  }
                                                  else {
                                                    (**(code **)(*(long *)local_1c8.m + 0x90))
                                                              (&local_1e8,local_1c8.m,&local_1c8,0);
                                                  }
                                                  iVar5 = QVariant::toInt((bool *)local_1e8.data);
                                                  cVar2 = QTest::qCompare(iVar5,0,
                                                  "testModel.index(1, 0, parIndex).data().toInt()",
                                                  "0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6b9);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x2);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    iVar5 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar5,1,
                                                  "testModel.index(2, 0, parIndex).data().toInt()",
                                                  "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6ba);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x3);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    iVar5 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar5,3,
                                                  "testModel.index(3, 0, parIndex).data().toInt()",
                                                  "3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6bb);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x4);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    iVar5 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar5,4,
                                                  "testModel.index(4, 0, parIndex).data().toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6bc);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x5);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    iVar5 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar5,5,
                                                  "testModel.index(5, 0, parIndex).data().toInt()",
                                                  "5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6bd);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x0);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    local_1b0[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ea.ucs = L'c';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_1b0,&local_1ea,
                                                                                                                                              
                                                  "testModel.index(0, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6be);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x1);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    local_1b0[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ea.ucs = L'a';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_1b0,&local_1ea,
                                                                                                                                              
                                                  "testModel.index(1, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'a\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6bf);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x2);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    local_1b0[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ea.ucs = L'b';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_1b0,&local_1ea,
                                                                                                                                              
                                                  "testModel.index(2, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6c0);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x3);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    local_1b0[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ea.ucs = L'd';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_1b0,&local_1ea,
                                                                                                                                              
                                                  "testModel.index(3, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'d\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6c1);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x4);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    local_1b0[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ea.ucs = L'e';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_1b0,&local_1ea,
                                                                                                                                              
                                                  "testModel.index(4, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'e\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6c2);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x5);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    local_1b0[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ea.ucs = L'f';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_1b0,&local_1ea,
                                                                                                                                              
                                                  "testModel.index(5, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'f\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6c3);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    QPersistentModelIndex::data((int)&local_1e8);
                                                    local_1c8.r._0_2_ =
                                                         QVariant::value<QChar>
                                                                   ((QVariant *)&local_1e8);
                                                    local_1b0[0].ucs = L'c';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      ((QChar *)&local_1c8,local_1b0
                                                                       ,
                                                  "twoIndex.data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6c4);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    iVar5 = QPersistentModelIndex::row();
                                                    cVar2 = QTest::qCompare(iVar5,0,"twoIndex.row()"
                                                                            ,"0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6c5);
                                                  if (cVar2 != '\0') {
                                                    lVar6 = 0;
                                                    do {
                                                      lVar1 = *(long *)((long)local_168 + lVar6);
                                                      cVar2 = QTest::qCompare(*(longlong *)
                                                                               (lVar1 + 0x20),1,
                                                                              "spy->count()","1",
                                                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6c7);
                                                  if (cVar2 == '\0') goto LAB_00125253;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)&local_1e8,
                                                             (QList<QList<QVariant>_> *)
                                                             (lVar1 + 0x10));
                                                  QVariant::value<QModelIndex>
                                                            (&local_1c8,(QVariant *)local_1e8._8_8_)
                                                  ;
                                                  bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    (&local_1c8,&local_188,
                                                                                                                                          
                                                  "args.at(0).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6c9);
                                                  if (!bVar4) goto LAB_00125249;
                                                  iVar5 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x20));
                                                  cVar2 = QTest::qCompare(iVar5,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6ca);
                                                  if (cVar2 == '\0') goto LAB_00125249;
                                                  iVar5 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x40));
                                                  cVar2 = QTest::qCompare(iVar5,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6cb);
                                                  if (cVar2 == '\0') goto LAB_00125249;
                                                  QVariant::value<QModelIndex>
                                                            (&local_1c8,
                                                             (QVariant *)(local_1e8._8_8_ + 0x60));
                                                  bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    (&local_1c8,&local_188,
                                                                                                                                          
                                                  "args.at(3).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6cc);
                                                  if (!bVar4) goto LAB_00125249;
                                                  iVar5 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x80));
                                                  cVar2 = QTest::qCompare(iVar5,0,
                                                  "args.at(4).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6cd);
                                                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                            ((QArrayDataPointer<QVariant> *)
                                                             &local_1e8);
                                                  if (cVar2 == '\0') goto LAB_00125253;
                                                  lVar6 = lVar6 + 8;
                                                  } while (lVar6 != 0x10);
                                                  moveRowsTreeSameBranch::anon_class_16_2_c8a22591::
                                                  operator()(&local_150);
                                                  GenericModel::index((int)&local_1e8,
                                                                      (int)&local_1a8,
                                                                      (QModelIndex *)0x2);
                                                  QPersistentModelIndex::operator=
                                                            (local_170,(QModelIndex *)&local_1e8);
                                                  bVar4 = (bool)GenericModel::moveRows
                                                                          (&local_1a8,
                                                                           (int)&local_188,2,
                                                                           (QModelIndex *)0x1,
                                                                           (int)&local_188);
                                                  cVar2 = QTest::qVerify(bVar4,
                                                  "testModel.moveRows(parIndex, 2, 1, parIndex, 6)",
                                                  "",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6d2);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x0);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    iVar5 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar5,0,
                                                  "testModel.index(0, 0, parIndex).data().toInt()",
                                                  "0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6d3);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x1);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    iVar5 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar5,1,
                                                  "testModel.index(1, 0, parIndex).data().toInt()",
                                                  "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6d4);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x2);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    iVar5 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar5,3,
                                                  "testModel.index(2, 0, parIndex).data().toInt()",
                                                  "3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6d5);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x3);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    iVar5 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar5,4,
                                                  "testModel.index(3, 0, parIndex).data().toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6d6);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x4);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    iVar5 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar5,5,
                                                  "testModel.index(4, 0, parIndex).data().toInt()",
                                                  "5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6d7);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x5);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    iVar5 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar5,2,
                                                  "testModel.index(5, 0, parIndex).data().toInt()",
                                                  "2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6d8);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x0);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    local_1b0[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ea.ucs = L'a';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_1b0,&local_1ea,
                                                                                                                                              
                                                  "testModel.index(0, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'a\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6d9);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x1);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    local_1b0[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ea.ucs = L'b';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_1b0,&local_1ea,
                                                                                                                                              
                                                  "testModel.index(1, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6da);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x2);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    local_1b0[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ea.ucs = L'd';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_1b0,&local_1ea,
                                                                                                                                              
                                                  "testModel.index(2, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'d\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6db);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x3);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    local_1b0[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ea.ucs = L'e';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_1b0,&local_1ea,
                                                                                                                                              
                                                  "testModel.index(3, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'e\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6dc);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x4);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    local_1b0[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ea.ucs = L'f';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_1b0,&local_1ea,
                                                                                                                                              
                                                  "testModel.index(4, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'f\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6dd);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x5);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    local_1b0[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ea.ucs = L'c';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_1b0,&local_1ea,
                                                                                                                                              
                                                  "testModel.index(5, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6de);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    QPersistentModelIndex::data((int)&local_1e8);
                                                    local_1c8.r._0_2_ =
                                                         QVariant::value<QChar>
                                                                   ((QVariant *)&local_1e8);
                                                    local_1b0[0].ucs = L'c';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      ((QChar *)&local_1c8,local_1b0
                                                                       ,
                                                  "twoIndex.data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6df);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    iVar5 = QPersistentModelIndex::row();
                                                    cVar2 = QTest::qCompare(iVar5,5,"twoIndex.row()"
                                                                            ,"5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6e0);
                                                  if (cVar2 != '\0') {
                                                    lVar6 = 0;
                                                    do {
                                                      lVar1 = *(long *)((long)local_168 + lVar6);
                                                      cVar2 = QTest::qCompare(*(longlong *)
                                                                               (lVar1 + 0x20),1,
                                                                              "spy->count()","1",
                                                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6e2);
                                                  if (cVar2 == '\0') goto LAB_00125253;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)&local_1e8,
                                                             (QList<QList<QVariant>_> *)
                                                             (lVar1 + 0x10));
                                                  QVariant::value<QModelIndex>
                                                            (&local_1c8,(QVariant *)local_1e8._8_8_)
                                                  ;
                                                  bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    (&local_1c8,&local_188,
                                                                                                                                          
                                                  "args.at(0).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6e4);
                                                  if (!bVar4) goto LAB_00125249;
                                                  iVar5 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x20));
                                                  cVar2 = QTest::qCompare(iVar5,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6e5);
                                                  if (cVar2 == '\0') goto LAB_00125249;
                                                  iVar5 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x40));
                                                  cVar2 = QTest::qCompare(iVar5,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6e6);
                                                  if (cVar2 == '\0') goto LAB_00125249;
                                                  QVariant::value<QModelIndex>
                                                            (&local_1c8,
                                                             (QVariant *)(local_1e8._8_8_ + 0x60));
                                                  bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    (&local_1c8,&local_188,
                                                                                                                                          
                                                  "args.at(3).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6e7);
                                                  if (!bVar4) goto LAB_00125249;
                                                  iVar5 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x80));
                                                  cVar2 = QTest::qCompare(iVar5,6,
                                                  "args.at(4).toInt()","6",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6e8);
                                                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                            ((QArrayDataPointer<QVariant> *)
                                                             &local_1e8);
                                                  if (cVar2 == '\0') goto LAB_00125253;
                                                  lVar6 = lVar6 + 8;
                                                  } while (lVar6 != 0x10);
                                                  moveRowsTreeSameBranch::anon_class_16_2_c8a22591::
                                                  operator()(&local_150);
                                                  GenericModel::index((int)&local_1e8,
                                                                      (int)&local_1a8,
                                                                      (QModelIndex *)0x1);
                                                  QPersistentModelIndex::QPersistentModelIndex
                                                            ((QPersistentModelIndex *)local_1b0,
                                                             (QModelIndex *)&local_1e8);
                                                  bVar4 = (bool)GenericModel::moveRows
                                                                          (&local_1a8,
                                                                           (int)&local_188,0,
                                                                           (QModelIndex *)0x2,
                                                                           (int)&local_188);
                                                  cVar2 = QTest::qVerify(bVar4,
                                                  "testModel.moveRows(parIndex, 0, 2, parIndex, 3)",
                                                  "",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6ed);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x0);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    iVar5 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar5,2,
                                                  "testModel.index(0, 0, parIndex).data().toInt()",
                                                  "2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6ee);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x1);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    iVar5 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar5,0,
                                                  "testModel.index(1, 0, parIndex).data().toInt()",
                                                  "0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6ef);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x2);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    iVar5 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar5,1,
                                                  "testModel.index(2, 0, parIndex).data().toInt()",
                                                  "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f0);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x3);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    iVar5 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar5,3,
                                                  "testModel.index(3, 0, parIndex).data().toInt()",
                                                  "3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f1);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x4);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    iVar5 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar5,4,
                                                  "testModel.index(4, 0, parIndex).data().toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f2);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x5);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    iVar5 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar5,5,
                                                  "testModel.index(5, 0, parIndex).data().toInt()",
                                                  "5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f3);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x0);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    local_1ea = QVariant::value<QChar>
                                                                          ((QVariant *)&local_1e8);
                                                    local_18a.ucs = L'c';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (&local_1ea,&local_18a,
                                                                                                                                              
                                                  "testModel.index(0, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f4);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x1);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    local_1ea = QVariant::value<QChar>
                                                                          ((QVariant *)&local_1e8);
                                                    local_18a.ucs = L'a';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (&local_1ea,&local_18a,
                                                                                                                                              
                                                  "testModel.index(1, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'a\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f5);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x2);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    local_1ea = QVariant::value<QChar>
                                                                          ((QVariant *)&local_1e8);
                                                    local_18a.ucs = L'b';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (&local_1ea,&local_18a,
                                                                                                                                              
                                                  "testModel.index(2, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f6);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x3);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    local_1ea = QVariant::value<QChar>
                                                                          ((QVariant *)&local_1e8);
                                                    local_18a.ucs = L'd';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (&local_1ea,&local_18a,
                                                                                                                                              
                                                  "testModel.index(3, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'d\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f7);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x4);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    local_1ea = QVariant::value<QChar>
                                                                          ((QVariant *)&local_1e8);
                                                    local_18a.ucs = L'e';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (&local_1ea,&local_18a,
                                                                                                                                              
                                                  "testModel.index(4, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'e\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f8);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    GenericModel::index((int)&local_1c8,
                                                                        (int)&local_1a8,
                                                                        (QModelIndex *)0x5);
                                                    if (local_1c8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1c8.m + 0x90))
                                                                (&local_1e8,local_1c8.m,&local_1c8,0
                                                                );
                                                    }
                                                    local_1ea = QVariant::value<QChar>
                                                                          ((QVariant *)&local_1e8);
                                                    local_18a.ucs = L'f';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (&local_1ea,&local_18a,
                                                                                                                                              
                                                  "testModel.index(5, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'f\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6f9);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    QPersistentModelIndex::data((int)&local_1e8);
                                                    local_1c8.r._0_2_ =
                                                         QVariant::value<QChar>
                                                                   ((QVariant *)&local_1e8);
                                                    local_1ea.ucs = L'b';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      ((QChar *)&local_1c8,
                                                                       &local_1ea,
                                                                                                                                              
                                                  "oneIndex.data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6fa);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    iVar5 = QPersistentModelIndex::row();
                                                    cVar2 = QTest::qCompare(iVar5,2,"oneIndex.row()"
                                                                            ,"2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6fb);
                                                  if (cVar2 != '\0') {
                                                    lVar6 = 0;
                                                    do {
                                                      lVar1 = *(long *)((long)local_168 + lVar6);
                                                      cVar2 = QTest::qCompare(*(longlong *)
                                                                               (lVar1 + 0x20),1,
                                                                              "spy->count()","1",
                                                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6fd);
                                                  if (cVar2 == '\0') break;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)&local_1e8,
                                                             (QList<QList<QVariant>_> *)
                                                             (lVar1 + 0x10));
                                                  QVariant::value<QModelIndex>
                                                            (&local_1c8,(QVariant *)local_1e8._8_8_)
                                                  ;
                                                  bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    (&local_1c8,&local_188,
                                                                                                                                          
                                                  "args.at(0).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6ff);
                                                  if (!bVar4) {
LAB_00125d24:
                                                    QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                              ((QArrayDataPointer<QVariant> *)
                                                               &local_1e8);
                                                    break;
                                                  }
                                                  iVar5 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x20));
                                                  cVar2 = QTest::qCompare(iVar5,0,
                                                  "args.at(1).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x700);
                                                  if (cVar2 == '\0') goto LAB_00125d24;
                                                  iVar5 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x40));
                                                  cVar2 = QTest::qCompare(iVar5,1,
                                                  "args.at(2).toInt()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x701);
                                                  if (cVar2 == '\0') goto LAB_00125d24;
                                                  QVariant::value<QModelIndex>
                                                            (&local_1c8,
                                                             (QVariant *)(local_1e8._8_8_ + 0x60));
                                                  bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    (&local_1c8,&local_188,
                                                                                                                                          
                                                  "args.at(3).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x702);
                                                  if (!bVar4) goto LAB_00125d24;
                                                  iVar5 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x80));
                                                  bVar3 = QTest::qCompare(iVar5,3,
                                                  "args.at(4).toInt()","3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x703);
                                                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                            ((QArrayDataPointer<QVariant> *)
                                                             &local_1e8);
                                                  bVar4 = lVar6 != 8;
                                                  lVar6 = lVar6 + 8;
                                                  } while ((bVar3 & bVar4) != 0);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  QPersistentModelIndex::~QPersistentModelIndex
                                                            ((QPersistentModelIndex *)local_1b0);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_00125253;
              }
            }
          }
        }
      }
    }
  }
  goto LAB_00125260;
LAB_00125249:
  QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_1e8);
LAB_00125253:
  QPersistentModelIndex::~QPersistentModelIndex(local_170);
LAB_00125260:
  local_b0._0_8_ = &PTR_metaObject_00165910;
  QObject::~QObject((QObject *)((long)&local_b0 + 0x58));
  if (&(local_b0.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_b0.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_b0 + 0x10));
  QObject::~QObject(&local_b0.super_QObject);
LAB_001252e7:
  local_130._0_8_ = &PTR_metaObject_00165910;
  QObject::~QObject((QObject *)((long)&local_130 + 0x58));
  if (&(local_130.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_130.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_130.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_130.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_130 + 0x10));
  QObject::~QObject(&local_130.super_QObject);
  QObject::~QObject((QObject *)local_140);
  GenericModel::~GenericModel((GenericModel *)&local_1a8);
  return;
}

Assistant:

void tst_GenericModel::moveRowsTreeSameBranch()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    testModel.insertColumns(0, 2);
    testModel.insertRows(0, 3);
    const QModelIndex parIndex = testModel.index(1, 0);
    testModel.insertColumns(0, 2, parIndex);
    testModel.insertRows(0, 6, parIndex);
    QSignalSpy rowsAboutToBeMovedSpy(&testModel, SIGNAL(rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsAboutToBeMovedSpy.isValid());
    QSignalSpy rowsMovedSpy(&testModel, SIGNAL(rowsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsMovedSpy.isValid());
    QSignalSpy *spyArr[] = {&rowsAboutToBeMovedSpy, &rowsMovedSpy};
    const auto resetData = [&testModel, &parIndex]() {
        for (int i = 0; i < 6; ++i) {
            testModel.setData(testModel.index(i, 0, parIndex), i);
            testModel.setData(testModel.index(i, 1, parIndex), QChar('a' + i));
        }
    };

    resetData();
    QVERIFY(!testModel.moveRows(parIndex, 2, 1, parIndex, -1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 2, 1, parIndex, 7));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, -1, 1, parIndex, 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 6, 1, parIndex, 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 1, 2, parIndex, 2));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 1, 2, parIndex, 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);

    QPersistentModelIndex twoIndex = testModel.index(2, 1, parIndex);
    QVERIFY(testModel.moveRows(parIndex, 2, 1, parIndex, 4));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toInt(), 0);
    QCOMPARE(testModel.index(1, 0, parIndex).data().toInt(), 1);
    QCOMPARE(testModel.index(2, 0, parIndex).data().toInt(), 3);
    QCOMPARE(testModel.index(3, 0, parIndex).data().toInt(), 2);
    QCOMPARE(testModel.index(4, 0, parIndex).data().toInt(), 4);
    QCOMPARE(testModel.index(5, 0, parIndex).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(1, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(2, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(3, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(4, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(5, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 3);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 4);
    }

    resetData();
    twoIndex = testModel.index(2, 1, parIndex);
    QVERIFY(testModel.moveRows(parIndex, 2, 1, parIndex, 0));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toInt(), 2);
    QCOMPARE(testModel.index(1, 0, parIndex).data().toInt(), 0);
    QCOMPARE(testModel.index(2, 0, parIndex).data().toInt(), 1);
    QCOMPARE(testModel.index(3, 0, parIndex).data().toInt(), 3);
    QCOMPARE(testModel.index(4, 0, parIndex).data().toInt(), 4);
    QCOMPARE(testModel.index(5, 0, parIndex).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(1, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(2, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(3, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(4, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(5, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 0);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 0);
    }

    resetData();
    twoIndex = testModel.index(2, 1, parIndex);
    QVERIFY(testModel.moveRows(parIndex, 2, 1, parIndex, 6));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toInt(), 0);
    QCOMPARE(testModel.index(1, 0, parIndex).data().toInt(), 1);
    QCOMPARE(testModel.index(2, 0, parIndex).data().toInt(), 3);
    QCOMPARE(testModel.index(3, 0, parIndex).data().toInt(), 4);
    QCOMPARE(testModel.index(4, 0, parIndex).data().toInt(), 5);
    QCOMPARE(testModel.index(5, 0, parIndex).data().toInt(), 2);
    QCOMPARE(testModel.index(0, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(1, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(2, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(3, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(4, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(testModel.index(5, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 5);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 6);
    }

    resetData();
    QPersistentModelIndex oneIndex = testModel.index(1, 1, parIndex);
    QVERIFY(testModel.moveRows(parIndex, 0, 2, parIndex, 3));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toInt(), 2);
    QCOMPARE(testModel.index(1, 0, parIndex).data().toInt(), 0);
    QCOMPARE(testModel.index(2, 0, parIndex).data().toInt(), 1);
    QCOMPARE(testModel.index(3, 0, parIndex).data().toInt(), 3);
    QCOMPARE(testModel.index(4, 0, parIndex).data().toInt(), 4);
    QCOMPARE(testModel.index(5, 0, parIndex).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(1, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(2, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(3, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(4, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(5, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(oneIndex.data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(oneIndex.row(), 2);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 1);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 3);
    }
}